

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

statement_base * __thiscall
cs::method_if::translate
          (method_if *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  compiler_type *this_00;
  token_base *ptVar1;
  _Elt_pointer pdVar2;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *pdVar3;
  _Elt_pointer ppsVar4;
  bool bVar5;
  int iVar6;
  const_reference pptVar7;
  token_base **pptVar8;
  bool *pbVar9;
  statement_ifelse *this_01;
  _Elt_pointer pptVar10;
  compile_error *this_02;
  _Elt_pointer ppsVar11;
  value_type *ppsVar12;
  value_type *ppsVar13;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *p_Var14;
  _Elt_pointer ppsVar15;
  value_type ptVar16;
  statement_base **ptr;
  value_type *__x;
  _Map_pointer pppsVar17;
  bool bVar18;
  allocator_type local_3c1;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> *local_3c0;
  tree_type<cs::token_base_*> local_3b8;
  tree_type<cs::token_base_*> local_3b0;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *local_3a8;
  _Map_pointer local_3a0;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_398;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_388;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_378;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_358;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body_true;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body_false;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_258;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_208;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_1b8;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_168;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_118;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_c8;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_78;
  _Self local_50;
  
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_Deque_base
            (&body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>);
  this_00 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  body_false.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_map =
       (_Map_pointer)
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_cur;
  body_false.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_map_size =
       (size_t)(raw->
               super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               )._M_impl.super__Deque_impl_data._M_start._M_first;
  body_false.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_last;
  body_false.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first =
       (_Elt_pointer)
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_node;
  local_3c0 = &context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>;
  std::operator+(&local_50,(_Self *)&body_false,1);
  local_78._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_78._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_78._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_78._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
              *)&body_true,&local_50,&local_78,&local_3c1);
  compiler_type::translate
            (this_00,(deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                      *)&body_true,&body);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            *)&body_true);
  ppsVar4 = body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  bVar18 = false;
  ppsVar11 = body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
  ppsVar15 = body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
  pppsVar17 = body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node;
  while (ppsVar11 != ppsVar4) {
    iVar6 = (*(*ppsVar11)->_vptr_statement_base[2])();
    bVar5 = bVar18;
    if ((iVar6 == 0xb) && (bVar5 = true, bVar18)) {
      this_02 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&body_true,"Multi Else Grammar.",(allocator *)&body_false);
      compile_error::compile_error(this_02,(string *)&body_true);
      __cxa_throw(this_02,&compile_error::typeinfo,compile_error::~compile_error);
    }
    bVar18 = bVar5;
    ppsVar11 = ppsVar11 + 1;
    if (ppsVar11 == ppsVar15) {
      ppsVar11 = pppsVar17[1];
      pppsVar17 = pppsVar17 + 1;
      ppsVar15 = ppsVar11 + 0x40;
    }
  }
  ppsVar13 = (value_type *)0x1;
  pptVar7 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar16 = *pptVar7;
  body_true.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)ptVar16[1]._vptr_token_base;
  pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)&body_true);
  ptVar16 = ptVar16 + 1;
  ptVar1 = *pptVar8;
  if (bVar18) {
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_Deque_base
              (&body_true.
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>);
    local_3a8 = raw;
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_Deque_base
              (&body_false.
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>);
    local_3a0 = body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node;
    bVar18 = true;
    ppsVar12 = body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last;
    __x = body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur;
    while (__x != body.
                  super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur) {
      iVar6 = (*(*__x)->_vptr_statement_base[2])();
      if (iVar6 == 0xb) {
LAB_0014f823:
        bVar18 = false;
      }
      else {
        ppsVar13 = __x;
        if (!bVar18) {
          std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::push_back
                    (&body_false,__x);
          goto LAB_0014f823;
        }
        bVar18 = true;
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::push_back
                  (&body_true,__x);
      }
      __x = __x + 1;
      if (__x == ppsVar12) {
        __x = local_3a0[1];
        local_3a0 = local_3a0 + 1;
        ppsVar12 = __x + 0x40;
      }
    }
    if (ptVar1 == (token_base *)0x0) {
LAB_0014fa3e:
      this_01 = (statement_ifelse *)
                statement_base::operator_new((statement_base *)0xc8,(size_t)ppsVar13);
      pdVar3 = local_3a8;
      tree_type<cs::token_base_*>::tree_type(&local_3b0,(tree_type<cs::token_base_*> *)ptVar16);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_168,
                 &body_true);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_1b8,
                 &body_false);
      std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_378,local_3c0);
      pdVar2 = (pdVar3->
               super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               )._M_impl.super__Deque_impl_data._M_start._M_cur;
      pptVar10 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pptVar10 ==
          (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        pptVar10 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      statement_ifelse::statement_ifelse
                (this_01,&local_3b0,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_168,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_1b8,
                 (context_t *)&local_378,pptVar10[-1]);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_378._M_refcount);
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (&local_1b8);
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (&local_168);
      tree_type<cs::token_base_*>::~tree_type(&local_3b0);
    }
    else {
      iVar6 = (*ptVar1->_vptr_token_base[2])(ptVar1);
      if (iVar6 != 7) goto LAB_0014fa3e;
      pbVar9 = cs_impl::any::const_val<bool>((any *)(ptVar1 + 1));
      pdVar3 = local_3a8;
      if (*pbVar9 == true) {
        this_01 = (statement_ifelse *)
                  statement_base::operator_new((statement_base *)0x70,(size_t)ppsVar13);
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                  ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_c8,
                   &body_true);
        std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_358,local_3c0);
        pdVar2 = (pdVar3->
                 super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 )._M_impl.super__Deque_impl_data._M_start._M_cur;
        pptVar10 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pptVar10 ==
            (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_first) {
          pptVar10 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                     )._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        statement_block::statement_block
                  ((statement_block *)this_01,
                   (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_c8,
                   (context_t *)&local_358,pptVar10[-1]);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_358._M_refcount);
        p_Var14 = &local_c8;
      }
      else {
        this_01 = (statement_ifelse *)
                  statement_base::operator_new((statement_base *)0x70,(size_t)ppsVar13);
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                  ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_118,
                   &body_false);
        std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_368,local_3c0);
        pdVar2 = (pdVar3->
                 super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 )._M_impl.super__Deque_impl_data._M_start._M_cur;
        pptVar10 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pptVar10 ==
            (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_first) {
          pptVar10 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                     )._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        statement_block::statement_block
                  ((statement_block *)this_01,
                   (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_118,
                   (context_t *)&local_368,pptVar10[-1]);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_368._M_refcount);
        p_Var14 = &local_118;
      }
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (p_Var14);
    }
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
              (&body_false.
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>);
    p_Var14 = &body_true.
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>;
  }
  else {
    if (ptVar1 == (token_base *)0x0) {
LAB_0014f9a3:
      this_01 = (statement_ifelse *)
                statement_base::operator_new((statement_base *)0x78,(size_t)ppsVar13);
      tree_type<cs::token_base_*>::tree_type(&local_3b8,(tree_type<cs::token_base_*> *)ptVar16);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_258,
                 &body);
      std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_398,local_3c0);
      pdVar2 = (raw->
               super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               )._M_impl.super__Deque_impl_data._M_start._M_cur;
      pptVar10 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pptVar10 ==
          (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        pptVar10 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      statement_if::statement_if
                ((statement_if *)this_01,&local_3b8,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_258,
                 (context_t *)&local_398,pptVar10[-1]);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_398._M_refcount);
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (&local_258);
      tree_type<cs::token_base_*>::~tree_type(&local_3b8);
      goto LAB_0014fba5;
    }
    iVar6 = (*ptVar1->_vptr_token_base[2])(ptVar1);
    if (iVar6 != 7) goto LAB_0014f9a3;
    pbVar9 = cs_impl::any::const_val<bool>((any *)(ptVar1 + 1));
    if (*pbVar9 != true) {
      this_01 = (statement_ifelse *)0x0;
      goto LAB_0014fba5;
    }
    this_01 = (statement_ifelse *)
              statement_base::operator_new((statement_base *)0x70,(size_t)ppsVar13);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_208,
               &body);
    std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_388,local_3c0);
    pdVar2 = (raw->
             super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar10 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar10 ==
        (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pptVar10 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    statement_block::statement_block
              ((statement_block *)this_01,
               (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_208,
               (context_t *)&local_388,pptVar10[-1]);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_388._M_refcount);
    p_Var14 = &local_208;
  }
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (p_Var14);
LAB_0014fba5:
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (&body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>);
  return &this_01->super_statement_base;
}

Assistant:

statement_base *method_if::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		bool have_else = false;
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		for (auto &ptr: body) {
			if (ptr->get_type() == statement_types::else_) {
				if (!have_else)
					have_else = true;
				else
					throw compile_error("Multi Else Grammar.");
			}
		}
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		token_base *ptr = tree.root().data();
		if (have_else) {
			std::deque<statement_base *> body_true;
			std::deque<statement_base *> body_false;
			bool now_place = true;
			for (auto &ptr: body) {
				if (ptr->get_type() == statement_types::else_) {
					now_place = false;
					continue;
				}
				if (now_place)
					body_true.push_back(ptr);
				else
					body_false.push_back(ptr);
			}
			if (ptr != nullptr && ptr->get_type() == token_types::value) {
				if (static_cast<token_value *>(ptr)->get_value().const_val<bool>())
					return new statement_block(body_true, context, raw.front().back());
				else
					return new statement_block(body_false, context, raw.front().back());
			}
			else
				return new statement_ifelse(tree, body_true, body_false, context, raw.front().back());
		}
		else if (ptr != nullptr && ptr->get_type() == token_types::value) {
			if (static_cast<token_value *>(ptr)->get_value().const_val<bool>())
				return new statement_block(body, context, raw.front().back());
			else
				return nullptr;
		}
		else
			return new statement_if(tree, body, context, raw.front().back());
	}